

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split.cpp
# Opt level: O3

void __thiscall
SplitNTest_random_vector_Test<char16_t>::TestBody(SplitNTest_random_vector_Test<char16_t> *this)

{
  void *pvVar1;
  long lVar2;
  char *pcVar3;
  vector<std::vector<char16_t,_std::allocator<char16_t>_>,_std::allocator<std::vector<char16_t,_std::allocator<char16_t>_>_>_>
  split_result;
  RandomTestData<char16_t,_std::vector<char16_t,_std::allocator<char16_t>_>_> data;
  unsigned_long local_d0;
  undefined1 local_c8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c0;
  pointer local_b8;
  long *local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a8;
  container_type_conflict11 local_a0;
  RandomTestData<char16_t,_std::vector<char16_t,_std::allocator<char16_t>_>_> local_88;
  
  RandomTestData<char16_t,_std::vector<char16_t,_std::allocator<char16_t>_>_>::RandomTestData
            (&local_88,L'\0',0,0);
  jessilib::
  split_n<std::vector,_std::vector<char16_t,_std::allocator<char16_t>_>,___gnu_cxx::__normal_iterator<const_char16_t_*,_std::vector<char16_t,_std::allocator<char16_t>_>_>,___gnu_cxx::__normal_iterator<const_char16_t_*,_std::vector<char16_t,_std::allocator<char16_t>_>_>,_char16_t>
            (&local_a0,
             (__normal_iterator<const_char16_t_*,_std::vector<char16_t,_std::allocator<char16_t>_>_>
             )local_88.m_str.super__Vector_base<char16_t,_std::allocator<char16_t>_>._M_impl.
              super__Vector_impl_data._M_start,
             (__normal_iterator<const_char16_t_*,_std::vector<char16_t,_std::allocator<char16_t>_>_>
             )local_88.m_str.super__Vector_base<char16_t,_std::allocator<char16_t>_>._M_impl.
              super__Vector_impl_data._M_finish,L'\0',4);
  local_b0 = (long *)(((long)local_a0.
                             super__Vector_base<std::vector<char16_t,_std::allocator<char16_t>_>,_std::allocator<std::vector<char16_t,_std::allocator<char16_t>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_a0.
                             super__Vector_base<std::vector<char16_t,_std::allocator<char16_t>_>,_std::allocator<std::vector<char16_t,_std::allocator<char16_t>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  local_d0 = 5;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_c8,"split_result.size()","n + 1",(unsigned_long *)&local_b0,&local_d0
            );
  if (local_c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_b0);
    if (local_c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/split.cpp"
               ,0xab,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_d0,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d0);
    if (local_b0 != (long *)0x0) {
      (**(code **)(*local_b0 + 8))();
    }
  }
  if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c0,local_c0);
  }
  lVar2 = 0;
  do {
    testing::internal::
    CmpHelperEQ<std::vector<char16_t,std::allocator<char16_t>>,std::vector<char16_t,std::allocator<char16_t>>>
              ((internal *)local_c8,"split_result[index]","data.m_tokens[index]",
               (vector<char16_t,_std::allocator<char16_t>_> *)
               ((long)&((local_a0.
                         super__Vector_base<std::vector<char16_t,_std::allocator<char16_t>_>,_std::allocator<std::vector<char16_t,_std::allocator<char16_t>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<char16_t,_std::allocator<char16_t>_>)._M_impl.
                       super__Vector_impl_data._M_start + lVar2),
               (vector<char16_t,_std::allocator<char16_t>_> *)
               ((long)&((local_88.m_tokens.
                         super__Vector_base<std::vector<char16_t,_std::allocator<char16_t>_>,_std::allocator<std::vector<char16_t,_std::allocator<char16_t>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<char16_t,_std::allocator<char16_t>_>)._M_impl.
                       super__Vector_impl_data._M_start + lVar2));
    if (local_c8[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_b0);
      pcVar3 = "";
      if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = (local_c0->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/split.cpp"
                 ,0xad,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_d0,(Message *)&local_b0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d0);
      if (local_b0 != (long *)0x0) {
        (**(code **)(*local_b0 + 8))();
      }
    }
    if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_c0,local_c0);
    }
    lVar2 = lVar2 + 0x18;
  } while (lVar2 != 0x60);
  RandomTestData<char16_t,_std::vector<char16_t,_std::allocator<char16_t>_>_>::get_remainder
            ((vector<char16_t,_std::allocator<char16_t>_> *)local_c8,&local_88,4);
  testing::internal::
  CmpHelperEQ<std::vector<char16_t,std::allocator<char16_t>>,std::vector<char16_t,std::allocator<char16_t>>>
            ((internal *)&local_b0,"split_result[n]","data.get_remainder(n)",
             local_a0.
             super__Vector_base<std::vector<char16_t,_std::allocator<char16_t>_>,_std::allocator<std::vector<char16_t,_std::allocator<char16_t>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 4,
             (vector<char16_t,_std::allocator<char16_t>_> *)local_c8);
  pvVar1 = (void *)CONCAT71(local_c8._1_7_,local_c8[0]);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,(long)local_b8 - (long)pvVar1);
  }
  if (local_b0._0_1_ == (Message)0x0) {
    testing::Message::Message((Message *)local_c8);
    if (local_a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_a8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/split.cpp"
               ,0xb0,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_d0,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d0);
    if ((long *)CONCAT71(local_c8._1_7_,local_c8[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_c8._1_7_,local_c8[0]) + 8))();
    }
  }
  if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a8,local_a8);
  }
  std::
  vector<std::vector<char16_t,_std::allocator<char16_t>_>,_std::allocator<std::vector<char16_t,_std::allocator<char16_t>_>_>_>
  ::~vector(&local_a0);
  std::
  vector<std::vector<char16_t,_std::allocator<char16_t>_>,_std::allocator<std::vector<char16_t,_std::allocator<char16_t>_>_>_>
  ::~vector(&local_88.m_tokens);
  if (local_88.m_str.super__Vector_base<char16_t,_std::allocator<char16_t>_>._M_impl.
      super__Vector_impl_data._M_start != (char16_t *)0x0) {
    operator_delete(local_88.m_str.super__Vector_base<char16_t,_std::allocator<char16_t>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_88.m_str.super__Vector_base<char16_t,_std::allocator<char16_t>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.m_str.super__Vector_base<char16_t,_std::allocator<char16_t>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_88.m_delim.super__Vector_base<char16_t,_std::allocator<char16_t>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.m_delim.super__Vector_base<char16_t,_std::allocator<char16_t>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_88.m_delim.super__Vector_base<char16_t,_std::allocator<char16_t>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.m_delim.super__Vector_base<char16_t,_std::allocator<char16_t>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TYPED_TEST(SplitNTest, random_vector) {
	RandomTestData<TypeParam, std::vector<TypeParam>> data{};
	constexpr size_t n = 4;
	std::vector<std::vector<TypeParam>> split_result = split_n<std::vector, std::vector<TypeParam>>(data.m_str, default_delim<TypeParam>, n);

	// Tokens shall be same up until last one (n + 1)
	EXPECT_EQ(split_result.size(), n + 1);
	for (size_t index = 0; index != n; ++index) {
		EXPECT_EQ(split_result[index], data.m_tokens[index]);
	}

	EXPECT_EQ(split_result[n], data.get_remainder(n));
}